

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileSize.cpp
# Opt level: O0

int64_t blc::tools::fileSize(ifstream *file,streampos pos,seekdir way)

{
  byte bVar1;
  streamoff sVar2;
  long in_RDI;
  int64_t len;
  fpos local_40 [16];
  streamoff local_30;
  long local_20;
  fpos local_18 [16];
  streamoff local_8;
  
  local_20 = in_RDI;
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_8 = -1;
  }
  else {
    std::istream::seekg(local_20,_S_beg);
    local_40 = (fpos  [16])std::istream::tellg();
    local_30 = std::fpos::operator_cast_to_long(local_40);
    sVar2 = std::fpos::operator_cast_to_long(local_18);
    std::istream::seekg(local_20,(_Ios_Seekdir)sVar2);
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

int64_t blc::tools::fileSize(std::ifstream &file, std::streampos pos, std::ios_base::seekdir way) {
	if (file.is_open() == false)
		return (-1);
	file.seekg(0, file.end);
	int64_t len = file.tellg();
	file.seekg(pos, way);

	return (len);
}